

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
flatbuffers::python::Keywords_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,python *this,Version *version)

{
  short sVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_8e5;
  undefined1 local_8e4;
  allocator<char> local_8e3;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  allocator<char> local_8e0;
  allocator<char> local_8df;
  allocator<char> local_8de;
  allocator<char> local_8dd;
  allocator<char> local_8dc;
  allocator<char> local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9;
  allocator<char> local_8d8;
  allocator<char> local_8d7;
  allocator<char> local_8d6;
  allocator<char> local_8d5;
  allocator<char> local_8d4;
  allocator<char> local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1;
  allocator<char> local_8d0;
  allocator<char> local_8cf;
  allocator<char> local_8ce;
  allocator<char> local_8cd;
  allocator<char> local_8cc;
  allocator<char> local_8cb;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  allocator<char> local_8c8;
  allocator<char> local_8c7;
  allocator<char> local_8c6;
  allocator<char> local_8c5;
  allocator<char> local_8c4;
  allocator<char> local_8c3;
  allocator<char> local_8c2;
  allocator<char> local_8c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  iterator local_458;
  size_type_conflict local_450;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_445;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_444 [2];
  allocator<char> local_442;
  allocator<char> local_441;
  allocator<char> local_440;
  allocator<char> local_43f;
  allocator<char> local_43e;
  allocator<char> local_43d;
  allocator<char> local_43c;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439;
  allocator<char> local_438;
  allocator<char> local_437;
  allocator<char> local_436;
  allocator<char> local_435;
  allocator<char> local_434;
  allocator<char> local_433;
  allocator<char> local_432;
  allocator<char> local_431;
  allocator<char> local_430;
  allocator<char> local_42f;
  allocator<char> local_42e;
  allocator<char> local_42d;
  allocator<char> local_42c;
  allocator<char> local_42b;
  allocator<char> local_42a;
  allocator<char> local_429;
  allocator<char> local_428;
  allocator<char> local_427;
  allocator<char> local_426;
  allocator<char> local_425 [20];
  allocator<char> local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  iterator local_28;
  size_type_conflict local_20;
  undefined1 local_18 [8];
  Version *version_local;
  
  sVar1 = *(short *)this;
  local_18 = (undefined1  [8])this;
  version_local = (Version *)__return_storage_ptr__;
  if (sVar1 != 0) {
    if (sVar1 == 2) {
      local_444[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_410 = &local_408;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"and",&local_411);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3e8,"as",local_425);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c8,"assert",&local_426);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3a8,"break",&local_427);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_388,"class",&local_428);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_368,"continue",&local_429);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_348,"def",&local_42a);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_328,"del",&local_42b);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_308,"elif",&local_42c);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2e8,"else",&local_42d);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2c8,"except",&local_42e);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2a8,"exec",&local_42f);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_288,"finally",&local_430);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_268,"for",&local_431);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_248,"from",&local_432);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_228,"global",&local_433);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_208,"if",&local_434);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1e8,"import",&local_435);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"in",&local_436);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1a8,"is",&local_437);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"lambda",&local_438);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"not",&local_439);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_148,"or",&local_43a);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_128,"pass",&local_43b);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_108,"print",&local_43c);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,"raise",&local_43d);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c8,"return",&local_43e);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"try",&local_43f);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,"while",&local_440);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_68,"with",&local_441);
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,"yield",&local_442);
      local_444[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_28 = &local_408;
      local_20 = 0x1f;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_445);
      __l_00._M_len = local_20;
      __l_00._M_array = local_28;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(__return_storage_ptr__,__l_00,local_444,&local_445);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_445);
      local_b00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
      do {
        local_b00 = local_b00 + -1;
        std::__cxx11::string::~string((string *)local_b00);
      } while (local_b00 != &local_408);
      std::allocator<char>::~allocator(&local_442);
      std::allocator<char>::~allocator(&local_441);
      std::allocator<char>::~allocator(&local_440);
      std::allocator<char>::~allocator(&local_43f);
      std::allocator<char>::~allocator(&local_43e);
      std::allocator<char>::~allocator(&local_43d);
      std::allocator<char>::~allocator(&local_43c);
      std::allocator<char>::~allocator(&local_43b);
      std::allocator<char>::~allocator(&local_43a);
      std::allocator<char>::~allocator(&local_439);
      std::allocator<char>::~allocator(&local_438);
      std::allocator<char>::~allocator(&local_437);
      std::allocator<char>::~allocator(&local_436);
      std::allocator<char>::~allocator(&local_435);
      std::allocator<char>::~allocator(&local_434);
      std::allocator<char>::~allocator(&local_433);
      std::allocator<char>::~allocator(&local_432);
      std::allocator<char>::~allocator(&local_431);
      std::allocator<char>::~allocator(&local_430);
      std::allocator<char>::~allocator(&local_42f);
      std::allocator<char>::~allocator(&local_42e);
      std::allocator<char>::~allocator(&local_42d);
      std::allocator<char>::~allocator(&local_42c);
      std::allocator<char>::~allocator(&local_42b);
      std::allocator<char>::~allocator(&local_42a);
      std::allocator<char>::~allocator(&local_429);
      std::allocator<char>::~allocator(&local_428);
      std::allocator<char>::~allocator(&local_427);
      std::allocator<char>::~allocator(&local_426);
      std::allocator<char>::~allocator(local_425);
      std::allocator<char>::~allocator(&local_411);
      return __return_storage_ptr__;
    }
    if (sVar1 != 3) {
      memset(__return_storage_ptr__,0,0x30);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  local_8e4 = 1;
  local_8c0 = &local_8b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"and",&local_8c1);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"as",&local_8c2);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"assert",&local_8c3);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_858,"async",&local_8c4);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_838,"await",&local_8c5);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"break",&local_8c6);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"class",&local_8c7);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d8,"continue",&local_8c8);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7b8,"def",&local_8c9);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_798,"del",&local_8ca);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_778,"elif",&local_8cb);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"else",&local_8cc);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_738,"except",&local_8cd);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_718,"False",&local_8ce);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"finally",&local_8cf);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"for",&local_8d0);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"from",&local_8d1);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_698,"global",&local_8d2);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_678,"if",&local_8d3);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_658,"import",&local_8d4);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"in",&local_8d5);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_618,"is",&local_8d6);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"lambda",&local_8d7);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"None",&local_8d8);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"nonlocal",&local_8d9);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_598,"not",&local_8da);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"or",&local_8db);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_558,"pass",&local_8dc);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_538,"raise",&local_8dd);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_518,"return",&local_8de);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"True",&local_8df);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"try",&local_8e0);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"while",&local_8e1);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_498,"with",&local_8e2);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_478,"yield",&local_8e3);
  local_8e4 = 0;
  local_458 = &local_8b8;
  local_450 = 0x23;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8e6);
  __l._M_len = local_450;
  __l._M_array = local_458;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__,__l,&local_8e5,&local_8e6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8e6);
  local_d78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458;
  do {
    local_d78 = local_d78 + -1;
    std::__cxx11::string::~string((string *)local_d78);
  } while (local_d78 != &local_8b8);
  std::allocator<char>::~allocator(&local_8e3);
  std::allocator<char>::~allocator(&local_8e2);
  std::allocator<char>::~allocator(&local_8e1);
  std::allocator<char>::~allocator(&local_8e0);
  std::allocator<char>::~allocator(&local_8df);
  std::allocator<char>::~allocator(&local_8de);
  std::allocator<char>::~allocator(&local_8dd);
  std::allocator<char>::~allocator(&local_8dc);
  std::allocator<char>::~allocator(&local_8db);
  std::allocator<char>::~allocator(&local_8da);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::~allocator(&local_8d8);
  std::allocator<char>::~allocator(&local_8d7);
  std::allocator<char>::~allocator(&local_8d6);
  std::allocator<char>::~allocator(&local_8d5);
  std::allocator<char>::~allocator(&local_8d4);
  std::allocator<char>::~allocator(&local_8d3);
  std::allocator<char>::~allocator(&local_8d2);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::~allocator(&local_8d0);
  std::allocator<char>::~allocator(&local_8cf);
  std::allocator<char>::~allocator(&local_8ce);
  std::allocator<char>::~allocator(&local_8cd);
  std::allocator<char>::~allocator(&local_8cc);
  std::allocator<char>::~allocator(&local_8cb);
  std::allocator<char>::~allocator(&local_8ca);
  std::allocator<char>::~allocator(&local_8c9);
  std::allocator<char>::~allocator(&local_8c8);
  std::allocator<char>::~allocator(&local_8c7);
  std::allocator<char>::~allocator(&local_8c6);
  std::allocator<char>::~allocator(&local_8c5);
  std::allocator<char>::~allocator(&local_8c4);
  std::allocator<char>::~allocator(&local_8c3);
  std::allocator<char>::~allocator(&local_8c2);
  std::allocator<char>::~allocator(&local_8c1);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> Keywords(const Version &version) {
  switch (version.major) {
    case 2:
      // https://docs.python.org/2/reference/lexical_analysis.html#keywords
      return {
          "and",   "as",     "assert", "break",  "class", "continue", "def",
          "del",   "elif",   "else",   "except", "exec",  "finally",  "for",
          "from",  "global", "if",     "import", "in",    "is",       "lambda",
          "not",   "or",     "pass",   "print",  "raise", "return",   "try",
          "while", "with",   "yield",
      };
    case 0:
    case 3:
      // https://docs.python.org/3/reference/lexical_analysis.html#keywords
      return {
          "and",      "as",       "assert",  "async", "await",  "break",
          "class",    "continue", "def",     "del",   "elif",   "else",
          "except",   "False",    "finally", "for",   "from",   "global",
          "if",       "import",   "in",      "is",    "lambda", "None",
          "nonlocal", "not",      "or",      "pass",  "raise",  "return",
          "True",     "try",      "while",   "with",  "yield",
      };
    default:
      return {};
  }
}